

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void __thiscall spatial_region::f_init_uniformB(spatial_region *this,double a0y,double a0z)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  celle ***pppcVar5;
  cellb ***pppcVar6;
  celle *pcVar7;
  cellb *pcVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  iVar2 = this->nx;
  if (0 < (long)iVar2) {
    uVar3 = this->ny;
    uVar4 = this->nz;
    lVar10 = 0;
    do {
      if (0 < (int)uVar3) {
        pppcVar5 = (this->ce).p._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl;
        pppcVar6 = (this->cb).p._M_t.
                   super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                   super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        uVar9 = 0;
        do {
          if (0 < (int)uVar4) {
            pcVar7 = pppcVar5[lVar10][uVar9];
            pcVar8 = pppcVar6[lVar10][uVar9];
            lVar11 = 0;
            do {
              puVar1 = (undefined8 *)((long)&pcVar7->ex + lVar11);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined8 *)((long)&pcVar7->ez + lVar11) = 0;
              *(undefined8 *)((long)&pcVar8->bx + lVar11) = 0;
              *(double *)((long)&pcVar8->by + lVar11) = a0y;
              *(double *)((long)&pcVar8->bz + lVar11) = a0z;
              lVar11 = lVar11 + 0x18;
            } while ((ulong)uVar4 * 0x18 != lVar11);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar3);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return;
}

Assistant:

void spatial_region::f_init_uniformB(double a0y, double a0z) {
    for(int i = 0; i < nx; ++i) {
        for(int j = 0; j < ny; ++j) {
            for(int k = 0; k < nz; ++k) {
                ce[i][j][k].ex = 0;
                ce[i][j][k].ey = 0;
                ce[i][j][k].ez = 0;
                cb[i][j][k].bx = 0;
                cb[i][j][k].by = a0y;
                cb[i][j][k].bz = a0z;
            }
        }
    }
}